

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O2

void __thiscall Excel::Book::onSheet(Book *this,size_t idx,wstring *name)

{
  _Alloc_hider __p;
  pointer in_RAX;
  pointer puVar1;
  __single_object sheet;
  _Alloc_hider local_18;
  
  local_18._M_p = (pointer)in_RAX;
  std::make_unique<Excel::Sheet,std::__cxx11::wstring_const&>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &stack0xffffffffffffffe8);
  puVar1 = (this->m_sheets).
           super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_sheets).
                    super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= idx) {
    std::
    vector<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
    ::resize(&this->m_sheets,idx + 1);
    puVar1 = (this->m_sheets).
             super__Vector_base<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>,_std::allocator<std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  __p._M_p = local_18._M_p;
  local_18._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<Excel::Sheet,_std::default_delete<Excel::Sheet>_>::reset
            ((__uniq_ptr_impl<Excel::Sheet,_std::default_delete<Excel::Sheet>_> *)(puVar1 + idx),
             (pointer)__p._M_p);
  std::unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_>::~unique_ptr
            ((unique_ptr<Excel::Sheet,_std::default_delete<Excel::Sheet>_> *)
             &stack0xffffffffffffffe8);
  return;
}

Assistant:

inline void
Book::onSheet( size_t idx, const std::wstring & name )
{
	auto sheet = std::make_unique< Sheet > ( name );
	if( m_sheets.size() <= idx )
		m_sheets.resize( idx + 1 );
	m_sheets[ idx ] = std::move( sheet );
}